

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O2

lws_ssl_capable_status lws_tls_client_connect(lws *wsi)

{
  int n;
  uint uVar1;
  int iVar2;
  int *piVar3;
  lws_ssl_capable_status lVar4;
  ulong __n;
  uint len;
  uchar *prot;
  char a [32];
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  ERR_clear_error();
  n = SSL_connect((SSL *)(wsi->tls).ssl);
  if (n == 1) {
    SSL_get0_alpn_selected((wsi->tls).ssl,&prot,&len);
    if (0x1f < len) {
      len = 0x1f;
    }
    __n = (ulong)len;
    memcpy(a,prot,__n);
    a[__n] = '\0';
    lws_role_call_alpn_negotiated(wsi,a);
    lVar4 = LWS_SSL_CAPABLE_DONE;
    _lws_log(8,"client connect OK\n");
    lws_openssl_describe_cipher(wsi);
  }
  else {
    uVar1 = lws_ssl_get_error(wsi,n);
    if ((uVar1 & 0xfffffffb) == 1) {
      lVar4 = LWS_SSL_CAPABLE_ERROR;
    }
    else {
      lVar4 = LWS_SSL_CAPABLE_MORE_SERVICE_READ;
      if (uVar1 != 2) {
        iVar2 = SSL_want((SSL *)(wsi->tls).ssl);
        if (iVar2 != 3) {
          lVar4 = LWS_SSL_CAPABLE_MORE_SERVICE_WRITE;
          if (uVar1 != 3) {
            iVar2 = SSL_want((SSL *)(wsi->tls).ssl);
            if (iVar2 != 2) {
              lVar4 = -(uint)(n != 0) | LWS_SSL_CAPABLE_MORE_SERVICE;
            }
          }
        }
      }
    }
  }
  return lVar4;
}

Assistant:

enum lws_ssl_capable_status
lws_tls_client_connect(struct lws *wsi)
{
#if defined(LWS_HAVE_SSL_set_alpn_protos) && \
    defined(LWS_HAVE_SSL_get0_alpn_selected)
	const unsigned char *prot;
	char a[32];
	unsigned int len;
#endif
	int m, n;

	errno = 0;
	ERR_clear_error();
	n = SSL_connect(wsi->tls.ssl);
	if (n == 1) {
#if defined(LWS_HAVE_SSL_set_alpn_protos) && \
    defined(LWS_HAVE_SSL_get0_alpn_selected)
		SSL_get0_alpn_selected(wsi->tls.ssl, &prot, &len);

		if (len >= sizeof(a))
			len = sizeof(a) - 1;
		memcpy(a, (const char *)prot, len);
		a[len] = '\0';

		lws_role_call_alpn_negotiated(wsi, (const char *)a);
#endif
		lwsl_info("client connect OK\n");
		lws_openssl_describe_cipher(wsi);
		return LWS_SSL_CAPABLE_DONE;
	}

	m = lws_ssl_get_error(wsi, n);

	if (m == SSL_ERROR_SYSCALL || m == SSL_ERROR_SSL)
		return LWS_SSL_CAPABLE_ERROR;

	if (m == SSL_ERROR_WANT_READ || SSL_want_read(wsi->tls.ssl))
		return LWS_SSL_CAPABLE_MORE_SERVICE_READ;

	if (m == SSL_ERROR_WANT_WRITE || SSL_want_write(wsi->tls.ssl))
		return LWS_SSL_CAPABLE_MORE_SERVICE_WRITE;

	if (!n) /* we don't know what he wants, but he says to retry */
		return LWS_SSL_CAPABLE_MORE_SERVICE;

	return LWS_SSL_CAPABLE_ERROR;
}